

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O0

int nonlin_common(Item *q4,int sensused)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  int count_deriv;
  char *eqtype;
  int dim_1;
  int dim;
  Symbol *s;
  int using_array;
  int counte;
  int counts;
  int i;
  Item *q;
  Item *qs;
  Item *lq;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Item *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Symbol *in_stack_ffffffffffffffc0;
  uint local_34;
  uint local_30;
  int local_2c;
  Item *local_20;
  Item *local_18;
  
  local_34 = 0;
  bVar1 = false;
  for (local_2c = 0x41; local_2c < 0x7b; local_2c = local_2c + 1) {
    for (local_20 = symlist[local_2c]->next; local_20 != symlist[local_2c];
        local_20 = local_20->next) {
      in_stack_ffffffffffffffc0 = (local_20->element).sym;
      if ((((in_stack_ffffffffffffffc0->subtype & 0x10U) != 0) &&
          (in_stack_ffffffffffffffc0->used != 0)) &&
         ((in_stack_ffffffffffffffc0->subtype & 0x20U) != 0)) {
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffc0->araydim;
      }
    }
  }
  local_30 = 0;
  for (local_2c = 0x41; local_2c < 0x7b; local_2c = local_2c + 1) {
    for (local_20 = symlist[local_2c]->next; local_20 != symlist[local_2c];
        local_20 = local_20->next) {
      in_stack_ffffffffffffffc0 = (local_20->element).sym;
      if (((in_stack_ffffffffffffffc0->subtype & 0x10U) != 0) &&
         (in_stack_ffffffffffffffc0->used != 0)) {
        in_stack_ffffffffffffffc0->varnum = local_30;
        slist_data(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
        if ((in_stack_ffffffffffffffc0->subtype & 0x20U) == 0) {
          sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",(ulong)(uint)numlist,(ulong)local_30,
                  in_stack_ffffffffffffffc0->name);
          local_30 = local_30 + 1;
        }
        else {
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffc0->araydim;
          bVar1 = true;
          sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",
                  (ulong)in_stack_ffffffffffffffb8,(ulong)(uint)numlist,(ulong)local_30,
                  in_stack_ffffffffffffffc0->name);
          local_30 = in_stack_ffffffffffffffb8 + local_30;
        }
        lappendstr(in_stack_ffffffffffffffb0,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        in_stack_ffffffffffffffc0->used = 0;
        if (in_ESI != 0) {
          add_sens_statelist((Symbol *)0x1210bf);
        }
      }
    }
  }
  for (local_18 = eqnq->next; local_18 != eqnq; local_18 = local_18->next) {
    in_stack_ffffffffffffffb0 = *(Item **)(((local_18->element).sym)->subtype + 0x48);
    iVar2 = strcmp((char *)in_stack_ffffffffffffffb0,"~+");
    if (iVar2 == 0) {
      if (local_34 == 0xffffffff) {
        diag((char *)in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      sprintf(buf,"_dlist%d[_counte] +=",(ulong)(uint)numlist);
    }
    else if ((char)in_stack_ffffffffffffffb0->itemtype == 'D') {
      in_stack_ffffffffffffffac = *(int *)(((local_18->element).sym)->subtype + 0x38);
      sprintf(buf,"_dlist%d[(++_counte)*_STRIDE] =",(ulong)(uint)numlist);
      local_34 = in_stack_ffffffffffffffac + local_34;
    }
    else {
      sprintf(buf,"_dlist%d[(++_counte)*_STRIDE] =",(ulong)(uint)numlist);
      local_34 = local_34 + 1;
    }
    replacstr(in_stack_ffffffffffffffb0,
              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (bVar1) {
    sprintf(buf,
            "if(_counte != %d) printf( \"Number of equations, %%d, does not equal number of states, %d\", _counte + 1);\n"
            ,(ulong)(local_30 - 1),(ulong)local_30);
    insertstr(in_stack_ffffffffffffffb0,
              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else if (local_34 != local_30) {
    sprintf(buf,"Number of equations, %d, does not equal number, %d",(ulong)local_34,(ulong)local_30
           );
    diag((char *)in_stack_ffffffffffffffb0,
         (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (local_34 == 0) {
    diag((char *)in_stack_ffffffffffffffb0,
         (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  freeqnqueue();
  sprintf(buf,"_slist%d",(ulong)(uint)numlist);
  add_global_var((char *)in_stack_ffffffffffffffc0,
                 (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  return local_30;
}

Assistant:

static int nonlin_common(q4, sensused)	/* used by massagenonlin() and mixed_eqns() */
	Item *q4;
	int sensused;
{
	Item *lq, *qs, *q;
	int i, counts = 0, counte = 0, using_array;
	Symbol *s;

	using_array=0;

	counts =0;
	SYMITER_STAT {
		if (s->used) {
			if (s->subtype & ARRAY) {int dim = s->araydim;
				counts += dim;
			}else{
				counts++;
			}
		}
	}

	counts = 0;
	SYMITER_STAT {
		if (s->used) {
			s->varnum = counts;
#if CVODE
			slist_data(s, counts, numlist);
#endif
			if (s->subtype & ARRAY) {int dim = s->araydim;
				using_array=1;
		        	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n"
			                ,dim, numlist , counts, s->name);
				counts += dim;
			}else{
				Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
					numlist, counts, s->name);
				counts++;
			}
		        Lappendstr(initlist, buf);
			s->used = 0;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}

	ITERATE(lq, eqnq) {
		char *eqtype = SYM(ITM(lq))->name;
		if (strcmp(eqtype, "~+") == 0) { /* add equation to previous */
			if (counte == -1) {
				diag("no previous equation for adding terms", (char *)0);
			}
			Sprintf(buf, "_dlist%d[_counte] +=", numlist);
		} else if (eqtype[0] == 'D') {
			/* derivative equations using implicit method */
			int count_deriv = SYM(ITM(lq))->araydim;
			Sprintf(buf, "_dlist%d[(++_counte)*_STRIDE] =", numlist);
			counte += count_deriv;
		}else{
			Sprintf(buf, "_dlist%d[(++_counte)*_STRIDE] =", numlist);
			counte++;
		}
		replacstr(ITM(lq), buf);
	}
	if (!using_array) {
		if(counte != counts) {
Sprintf(buf ,"Number of equations, %d, does not equal number, %d", counte, counts);
			diag(buf, " of states used");
		}
	} else {
#if 1	/* can give message when running */
Sprintf(buf, "if(_counte != %d) printf( \"Number of equations, %%d,\
 does not equal number of states, %d\", _counte + 1);\n",
			counts-1, counts);
		Insertstr(q4, buf);
#endif
	}
	if (counte == 0) {
		diag("NONLINEAR contains no equations", (char *)0);
	}
	freeqnqueue();
	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, counts*(1 + sens_parm), 1);
	return counts;
}